

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.h
# Opt level: O0

void __thiscall glslang::TParseContextBase::~TParseContextBase(TParseContextBase *this)

{
  code *pcVar1;
  TParseContextBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~TParseContextBase() { }